

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_global_create_socket(int domain,int protocol)

{
  nn_socktype *pnVar1;
  uint fd;
  nn_sock *pnVar2;
  int in_ESI;
  int in_EDI;
  nn_sock *sock;
  nn_socktype *socktype;
  int i;
  int s;
  int rc;
  int local_18;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  if ((in_EDI == 1) || (in_EDI == 2)) {
    if (self.nsocks < 0x200) {
      fd = (uint)self.unused[0x1ff - self.nsocks];
      for (local_18 = 0; pnVar1 = nn_socktypes[local_18], pnVar1 != (nn_socktype *)0x0;
          local_18 = local_18 + 1) {
        if ((pnVar1->domain == in_EDI) && (pnVar1->protocol == in_ESI)) {
          pnVar2 = (nn_sock *)nn_alloc_(0x2eab50);
          if (pnVar2 == (nn_sock *)0x0) {
            return -0xc;
          }
          iVar3 = nn_sock_init((nn_sock *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                               (nn_socktype *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),fd);
          if (iVar3 < 0) {
            return iVar3;
          }
          self.socks[(int)fd] = pnVar2;
          self.nsocks = self.nsocks + 1;
          return fd;
        }
      }
      iVar3 = -0x16;
    }
    else {
      iVar3 = -0x18;
    }
  }
  else {
    iVar3 = -0x61;
  }
  return iVar3;
}

Assistant:

int nn_global_create_socket (int domain, int protocol)
{
    int rc;
    int s;
    int i;
    const struct nn_socktype *socktype;
    struct nn_sock *sock;

    /* The function is called with lock held */

    /*  Only AF_SP and AF_SP_RAW domains are supported. */
    if (domain != AF_SP && domain != AF_SP_RAW) {
        return -EAFNOSUPPORT;
    }

    /*  If socket limit was reached, report error. */
    if (self.nsocks >= NN_MAX_SOCKETS) {
        return -EMFILE;
    }

    /*  Find an empty socket slot. */
    s = self.unused [NN_MAX_SOCKETS - self.nsocks - 1];

    /*  Find the appropriate socket type. */
    for (i = 0; (socktype = nn_socktypes[i]) != NULL; i++) {
        if (socktype->domain == domain && socktype->protocol == protocol) {

            /*  Instantiate the socket. */
            if ((sock = nn_alloc (sizeof (struct nn_sock), "sock")) == NULL)
                return -ENOMEM;
            rc = nn_sock_init (sock, socktype, s);
            if (rc < 0)
                return rc;

            /*  Adjust the global socket table. */
            self.socks [s] = sock;
            ++self.nsocks;
            return s;
        }
    }
    /*  Specified socket type wasn't found. */
    return -EINVAL;
}